

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O0

bool __thiscall
Sphere::Intersect(Sphere *this,Ray *ray,float t_min,float t_max,hit_record_t *hit_record)

{
  float *in_RDX;
  Ray *in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float t;
  float fVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  float in_XMM1_Da;
  float _sqrt_da;
  float _neg_ba;
  float _t;
  float discriminant;
  float c;
  float b;
  float a;
  Vec3 oc;
  Vec3 _center;
  Ray *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  Vec3 *in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  float fStack_d8;
  float local_d4;
  float local_d0;
  float in_stack_ffffffffffffff34;
  float in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  Vec3 local_c0;
  float local_b4 [2];
  float in_stack_ffffffffffffff54;
  Sphere *in_stack_ffffffffffffff58;
  float local_a0;
  Vec3 local_88;
  float local_7c;
  Vec3 local_78;
  Vec3 local_6c;
  float local_60;
  Vec3 local_4c;
  Vec3 local_40;
  Vec3 local_34;
  float *local_28;
  float local_20;
  float local_1c;
  byte local_1;
  
  local_28 = in_RDX;
  local_20 = in_XMM1_Da;
  local_1c = in_XMM0_Da;
  Ray::GetTime(in_RSI);
  GetCenter(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
  Ray::GetOrigin(in_stack_fffffffffffffef8);
  operator-((Vec3 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
            (Vec3 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  Vec3::~Vec3(&local_4c);
  Ray::GetDirection(in_stack_fffffffffffffef8);
  Ray::GetDirection(in_stack_fffffffffffffef8);
  fVar1 = dot(&local_6c,&local_78);
  Vec3::~Vec3(&local_78);
  Vec3::~Vec3(&local_6c);
  local_60 = fVar1;
  Ray::GetDirection(in_stack_fffffffffffffef8);
  fVar2 = dot(&local_40,&local_88);
  Vec3::~Vec3(&local_88);
  local_7c = fVar2;
  t = dot(&local_40,&local_40);
  fVar3 = local_7c * local_7c + -(local_60 * (-in_RDI[8] * in_RDI[8] + t));
  if (0.0 < fVar3) {
    fVar4 = -local_7c / local_60;
    dVar6 = std::sqrt((double)(ulong)(uint)fVar3);
    fVar3 = SUB84(dVar6,0);
    fVar5 = fVar4 - fVar3 / local_60;
    if ((fVar5 < local_20) && (local_1c < fVar5)) {
      *local_28 = fVar5;
      Ray::GetPoint((Ray *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                    in_stack_ffffffffffffff34);
      local_28[5] = local_a0;
      *(Sphere **)(local_28 + 3) = in_stack_ffffffffffffff58;
      Vec3::~Vec3((Vec3 *)&stack0xffffffffffffff58);
      operator-((Vec3 *)CONCAT44(fVar1,fVar2),(Vec3 *)CONCAT44(t,fVar3));
      operator/((Vec3 *)CONCAT44(fVar1,fVar2),t);
      local_28[8] = in_stack_ffffffffffffff54;
      *(float (*) [2])(local_28 + 6) = local_b4;
      Vec3::~Vec3((Vec3 *)local_b4);
      Vec3::~Vec3(&local_c0);
      *(undefined8 *)(local_28 + 10) = *(undefined8 *)(in_RDI + 10);
      GetUV((Sphere *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
            in_stack_ffffffffffffff18,in_RDI,(float *)CONCAT44(fVar1,fVar2));
      local_1 = 1;
      goto LAB_00124cfe;
    }
    fVar4 = fVar4 + fVar3 / local_60;
    if ((fVar4 < local_20) && (local_1c < fVar4)) {
      *local_28 = fVar4;
      Ray::GetPoint((Ray *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                    in_stack_ffffffffffffff34);
      local_28[5] = in_stack_ffffffffffffff38;
      *(ulong *)(local_28 + 3) = CONCAT44(in_stack_ffffffffffffff34,local_d0);
      Vec3::~Vec3((Vec3 *)&local_d0);
      operator-((Vec3 *)CONCAT44(fVar1,fVar2),(Vec3 *)CONCAT44(t,fVar3));
      operator/((Vec3 *)CONCAT44(fVar1,fVar2),t);
      local_28[8] = local_d4;
      *(ulong *)(local_28 + 6) = CONCAT44(fStack_d8,in_stack_ffffffffffffff24);
      Vec3::~Vec3((Vec3 *)&stack0xffffffffffffff24);
      Vec3::~Vec3((Vec3 *)&stack0xffffffffffffff18);
      *(undefined8 *)(local_28 + 10) = *(undefined8 *)(in_RDI + 10);
      GetUV((Sphere *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
            in_stack_ffffffffffffff18,in_RDI,(float *)CONCAT44(fVar1,fVar2));
      local_1 = 1;
      goto LAB_00124cfe;
    }
  }
  local_1 = 0;
LAB_00124cfe:
  Vec3::~Vec3(&local_40);
  Vec3::~Vec3(&local_34);
  return (bool)(local_1 & 1);
}

Assistant:

bool
Sphere::Intersect(const Ray& ray, float t_min, float t_max, hit_record_t& hit_record) const
{
    Vec3  _center = GetCenter(ray.GetTime());

    Vec3  oc = ray.GetOrigin() - _center;
    float a  = dot(ray.GetDirection(), ray.GetDirection());
    float b  = dot(oc, ray.GetDirection());
    float c  = dot(oc, oc) - m_radius*m_radius;
    float discriminant = b*b - a*c;

    if (discriminant > 0) {
        float _t;
        float _neg_ba  = -b/a;
        float _sqrt_da = sqrt(discriminant)/a;
        
        _t = _neg_ba - _sqrt_da;
        if (_t < t_max && _t > t_min) {

            hit_record.m_t        = _t;
            hit_record.m_point    = ray.GetPoint(_t);
            hit_record.m_normal   = (hit_record.m_point - _center) / m_radius;
            hit_record.m_material = m_material;
			GetUV(hit_record.m_normal, hit_record.m_u, hit_record.m_v);

            return true;
        }
        
        _t = _neg_ba + _sqrt_da;
        if (_t < t_max && _t > t_min) {

            hit_record.m_t        = _t;
            hit_record.m_point    = ray.GetPoint(_t);
            hit_record.m_normal   = (hit_record.m_point - _center) / m_radius;
            hit_record.m_material = m_material;
			GetUV(hit_record.m_normal, hit_record.m_u, hit_record.m_v);

            return true;
        }
    }
    return false;
}